

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheObjectCopy(xmlXPathParserContextPtr pctxt,xmlXPathObjectPtr val)

{
  xmlNodeSetPtr val_00;
  xmlNodeSetPtr set;
  xmlXPathContextPtr ctxt;
  xmlXPathObjectPtr ret;
  xmlXPathObjectPtr val_local;
  xmlXPathParserContextPtr pctxt_local;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    return (xmlXPathObjectPtr)0x0;
  }
  if ((pctxt->context == (xmlXPathContextPtr)0x0) || (pctxt->context->cache == (void *)0x0)) {
switchD_0022c786_default:
    pctxt_local = (xmlXPathParserContextPtr)xmlXPathObjectCopy(val);
    if (pctxt_local == (xmlXPathParserContextPtr)0x0) {
      xmlXPathPErrMemory(pctxt);
    }
  }
  else {
    switch(val->type) {
    case XPATH_NODESET:
      val_00 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val->nodesetval);
      if (val_00 == (xmlNodeSetPtr)0x0) {
        xmlXPathPErrMemory(pctxt);
        pctxt_local = (xmlXPathParserContextPtr)0x0;
      }
      else {
        pctxt_local = (xmlXPathParserContextPtr)xmlXPathCacheWrapNodeSet(pctxt,val_00);
      }
      break;
    case XPATH_BOOLEAN:
      pctxt_local = (xmlXPathParserContextPtr)xmlXPathCacheNewBoolean(pctxt,val->boolval);
      break;
    case XPATH_NUMBER:
      pctxt_local = (xmlXPathParserContextPtr)xmlXPathCacheNewFloat(pctxt,val->floatval);
      break;
    case XPATH_STRING:
      pctxt_local = (xmlXPathParserContextPtr)xmlXPathCacheNewString(pctxt,val->stringval);
      break;
    default:
      goto switchD_0022c786_default;
    }
  }
  return (xmlXPathObjectPtr)pctxt_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheObjectCopy(xmlXPathParserContextPtr pctxt, xmlXPathObjectPtr val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if (val == NULL)
	return(NULL);

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	switch (val->type) {
            case XPATH_NODESET: {
                xmlNodeSetPtr set;

                set = xmlXPathNodeSetMerge(NULL, val->nodesetval);
                if (set == NULL) {
                    xmlXPathPErrMemory(pctxt);
                    return(NULL);
                }
                return(xmlXPathCacheWrapNodeSet(pctxt, set));
            }
	    case XPATH_STRING:
		return(xmlXPathCacheNewString(pctxt, val->stringval));
	    case XPATH_BOOLEAN:
		return(xmlXPathCacheNewBoolean(pctxt, val->boolval));
	    case XPATH_NUMBER:
		return(xmlXPathCacheNewFloat(pctxt, val->floatval));
	    default:
		break;
	}
    }
    ret = xmlXPathObjectCopy(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}